

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O2

void __thiscall VDasher::moveTo(VDasher *this,VPointF *p)

{
  size_t i;
  size_t sVar1;
  float fVar2;
  float fVar3;
  
  this->mDiscard = false;
  this->mStartNewSegment = true;
  this->mCurPt = *p;
  this->mIndex = 0;
  if (1e-06 <= ABS(this->mDashOffset)) {
    fVar3 = 0.0;
    for (sVar1 = 0; this->mArraySize != sVar1; sVar1 = sVar1 + 1) {
      fVar3 = this->mDashArray[sVar1].length + this->mDashArray[sVar1].gap;
    }
    fVar2 = fmodf(this->mDashOffset,fVar3);
    fVar3 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar2 |
                   (uint)(fVar3 + fVar2) & -(uint)(fVar2 < 0.0));
    for (sVar1 = 0; this->mArraySize != sVar1; sVar1 = sVar1 + 1) {
      fVar2 = this->mDashArray[sVar1].length;
      if (fVar3 < fVar2) {
        this->mIndex = sVar1;
        fVar2 = fVar2 - fVar3;
        this->mCurrentLength = fVar2;
        this->mDiscard = false;
        goto LAB_0010acf4;
      }
      fVar3 = fVar3 - fVar2;
      fVar2 = this->mDashArray[sVar1].gap;
      if (fVar3 < fVar2) {
        this->mIndex = sVar1;
        fVar2 = fVar2 - fVar3;
        this->mCurrentLength = fVar2;
        this->mDiscard = true;
        goto LAB_0010acf4;
      }
      fVar3 = fVar3 - fVar2;
    }
    fVar2 = this->mCurrentLength;
  }
  else {
    fVar2 = this->mDashArray->length;
    this->mCurrentLength = fVar2;
  }
LAB_0010acf4:
  if (1e-06 < ABS(fVar2)) {
    return;
  }
  updateActiveSegment(this);
  return;
}

Assistant:

void VDasher::moveTo(const VPointF &p)
{
    mDiscard = false;
    mStartNewSegment = true;
    mCurPt = p;
    mIndex = 0;

    if (!vCompare(mDashOffset, 0.0f)) {
        float totalLength = 0.0;
        for (size_t i = 0; i < mArraySize; i++) {
            totalLength = mDashArray[i].length + mDashArray[i].gap;
        }
        float normalizeLen = std::fmod(mDashOffset, totalLength);
        if (normalizeLen < 0.0f) {
            normalizeLen = totalLength + normalizeLen;
        }
        // now the length is less than total length and +ve
        // findout the current dash index , dashlength and gap.
        for (size_t i = 0; i < mArraySize; i++) {
            if (normalizeLen < mDashArray[i].length) {
                mIndex = i;
                mCurrentLength = mDashArray[i].length - normalizeLen;
                mDiscard = false;
                break;
            }
            normalizeLen -= mDashArray[i].length;
            if (normalizeLen < mDashArray[i].gap) {
                mIndex = i;
                mCurrentLength = mDashArray[i].gap - normalizeLen;
                mDiscard = true;
                break;
            }
            normalizeLen -= mDashArray[i].gap;
        }
    } else {
        mCurrentLength = mDashArray[mIndex].length;
    }
    if (vIsZero(mCurrentLength)) updateActiveSegment();
}